

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void ** stb_array_block_alloc(int count,int blocksize)

{
  void **q;
  char *p;
  int i;
  int blocksize_local;
  int count_local;
  
  _blocksize_local = (void **)malloc((long)count * 8 + (long)(count * blocksize));
  if (_blocksize_local == (void **)0x0) {
    _blocksize_local = (void **)0x0;
  }
  else {
    for (p._4_4_ = 0; p._4_4_ < count; p._4_4_ = p._4_4_ + 1) {
      _blocksize_local[p._4_4_] =
           (void *)((long)_blocksize_local + (long)(p._4_4_ * blocksize) + (long)count * 8);
    }
  }
  return _blocksize_local;
}

Assistant:

void **stb_array_block_alloc(int count, int blocksize)
{
   int i;
   char *p = (char *) malloc(sizeof(void *) * count + count * blocksize);
   void **q;
   if (p == NULL) return NULL;
   q = (void **) p;
   p += sizeof(void *) * count;
   for (i=0; i < count; ++i)
      q[i] = p + i * blocksize;
   return q;
}